

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>>
               (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *t)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)(t->super_RepeatedPtrFieldBase).current_size_;
  do {
    iVar2 = (int)uVar3;
    if (iVar2 < 1) break;
    lVar1 = uVar3 - 1;
    uVar3 = uVar3 - 1;
  } while ((~*(uint *)((long)((t->super_RepeatedPtrFieldBase).rep_)->elements[lVar1] + 0x10) & 3) ==
           0);
  return iVar2 < 1;
}

Assistant:

inline const typename TypeHandler::Type& RepeatedPtrFieldBase::Get(
    int index) const {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  return *cast<TypeHandler>(rep_->elements[index]);
}